

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BitvecSet(Bitvec *p,u32 i)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Bitvec *pBVar3;
  void *__dest;
  u32 i_00;
  bool bVar4;
  u32 *aiValues;
  uint local_28;
  int rc;
  uint j;
  u32 bin;
  u32 h;
  u32 i_local;
  Bitvec *p_local;
  
  if (p == (Bitvec *)0x0) {
    return 0;
  }
  bin = i - 1;
  _h = p;
  while( true ) {
    bVar4 = false;
    if (0xf80 < _h->iSize) {
      bVar4 = _h->iDivisor != 0;
    }
    if (!bVar4) break;
    uVar2 = bin / _h->iDivisor;
    bin = bin % _h->iDivisor;
    if (*(long *)((long)&_h->u + (ulong)uVar2 * 8) == 0) {
      pBVar3 = sqlite3BitvecCreate(_h->iDivisor);
      *(Bitvec **)((long)&_h->u + (ulong)uVar2 * 8) = pBVar3;
      if (*(long *)((long)&_h->u + (ulong)uVar2 * 8) == 0) {
        return 7;
      }
    }
    _h = *(Bitvec **)((long)&_h->u + (ulong)uVar2 * 8);
  }
  if (_h->iSize < 0xf81) {
    (_h->u).aBitmap[bin >> 3] = (_h->u).aBitmap[bin >> 3] | (byte)(1 << ((byte)bin & 7));
    return 0;
  }
  i_00 = bin + 1;
  j = bin % 0x7c;
  if (*(int *)((long)&_h->u + (ulong)j * 4) == 0) {
    if (_h->nSet < 0x7b) goto LAB_001406e4;
  }
  else {
    do {
      if (*(u32 *)((long)&_h->u + (ulong)j * 4) == i_00) {
        return 0;
      }
      j = j + 1;
      if (0x7b < j) {
        j = 0;
      }
    } while (*(int *)((long)&_h->u + (ulong)j * 4) != 0);
  }
  if (0x3d < _h->nSet) {
    __dest = sqlite3DbMallocRaw((sqlite3 *)0x0,0x1f0);
    if (__dest == (void *)0x0) {
      return 7;
    }
    memcpy(__dest,&_h->u,0x1f0);
    memset(&_h->u,0,0x1f0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)_h->iSize + 0x3d;
    _h->iDivisor = SUB164(auVar1 / ZEXT816(0x3e),0);
    aiValues._4_4_ = sqlite3BitvecSet(_h,i_00);
    for (local_28 = 0; local_28 < 0x7c; local_28 = local_28 + 1) {
      if (*(int *)((long)__dest + (ulong)local_28 * 4) != 0) {
        uVar2 = sqlite3BitvecSet(_h,*(u32 *)((long)__dest + (ulong)local_28 * 4));
        aiValues._4_4_ = uVar2 | aiValues._4_4_;
      }
    }
    sqlite3DbFree((sqlite3 *)0x0,__dest);
    return aiValues._4_4_;
  }
LAB_001406e4:
  _h->nSet = _h->nSet + 1;
  *(u32 *)((long)&_h->u + (ulong)j * 4) = i_00;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecSet(Bitvec *p, u32 i){
  u32 h;
  if( p==0 ) return SQLITE_OK;
  assert( i>0 );
  assert( i<=p->iSize );
  i--;
  while((p->iSize > BITVEC_NBIT) && p->iDivisor) {
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    if( p->u.apSub[bin]==0 ){
      p->u.apSub[bin] = sqlite3BitvecCreate( p->iDivisor );
      if( p->u.apSub[bin]==0 ) return SQLITE_NOMEM_BKPT;
    }
    p = p->u.apSub[bin];
  }
  if( p->iSize<=BITVEC_NBIT ){
    p->u.aBitmap[i/BITVEC_SZELEM] |= 1 << (i&(BITVEC_SZELEM-1));
    return SQLITE_OK;
  }
  h = BITVEC_HASH(i++);
  /* if there wasn't a hash collision, and this doesn't */
  /* completely fill the hash, then just add it without */
  /* worring about sub-dividing and re-hashing. */
  if( !p->u.aHash[h] ){
    if (p->nSet<(BITVEC_NINT-1)) {
      goto bitvec_set_end;
    } else {
      goto bitvec_set_rehash;
    }
  }
  /* there was a collision, check to see if it's already */
  /* in hash, if not, try to find a spot for it */
  do {
    if( p->u.aHash[h]==i ) return SQLITE_OK;
    h++;
    if( h>=BITVEC_NINT ) h = 0;
  } while( p->u.aHash[h] );
  /* we didn't find it in the hash.  h points to the first */
  /* available free spot. check to see if this is going to */
  /* make our hash too "full".  */
bitvec_set_rehash:
  if( p->nSet>=BITVEC_MXHASH ){
    unsigned int j;
    int rc;
    u32 *aiValues = sqlite3StackAllocRaw(0, sizeof(p->u.aHash));
    if( aiValues==0 ){
      return SQLITE_NOMEM_BKPT;
    }else{
      memcpy(aiValues, p->u.aHash, sizeof(p->u.aHash));
      memset(p->u.apSub, 0, sizeof(p->u.apSub));
      p->iDivisor = (p->iSize + BITVEC_NPTR - 1)/BITVEC_NPTR;
      rc = sqlite3BitvecSet(p, i);
      for(j=0; j<BITVEC_NINT; j++){
        if( aiValues[j] ) rc |= sqlite3BitvecSet(p, aiValues[j]);
      }
      sqlite3StackFree(0, aiValues);
      return rc;
    }
  }
bitvec_set_end:
  p->nSet++;
  p->u.aHash[h] = i;
  return SQLITE_OK;
}